

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O0

uint_type spvtools::utils::
          HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
          ::incrementSignificand(uint_type significand,uint_type to_increment,bool *carry)

{
  bool *carry_local;
  uint_type to_increment_local;
  uint_type significand_local;
  
  carry_local._4_4_ = significand + to_increment;
  *carry = false;
  if ((carry_local._4_4_ & 0x800000) != 0) {
    *carry = true;
    carry_local._4_4_ = (carry_local._4_4_ & 0xff7fffff) >> 1;
  }
  return carry_local._4_4_;
}

Assistant:

static uint_type incrementSignificand(uint_type significand,
                                        uint_type to_increment, bool* carry) {
    significand = static_cast<uint_type>(significand + to_increment);
    *carry = false;
    if (significand & first_exponent_bit) {
      *carry = true;
      // The implicit 1-bit will have carried, so we should zero-out the
      // top bit and shift back.
      significand = static_cast<uint_type>(significand & ~first_exponent_bit);
      significand = static_cast<uint_type>(significand >> 1);
    }
    return significand;
  }